

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int luaG_getfuncline(Proto *f,int pc)

{
  AbsLineInfo *pAVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  AbsLineInfo *pAVar9;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    return -1;
  }
  uVar5 = f->sizeabslineinfo;
  if ((uVar5 == 0) || (pAVar1 = f->abslineinfo, pc < pAVar1->pc)) {
    piVar8 = &f->linedefined;
    iVar7 = -1;
  }
  else {
    uVar2 = (uint)pc >> 7;
    if ((int)uVar5 <= (int)uVar2) {
      uVar5 = uVar2;
    }
    iVar7 = uVar2 - 2;
    pAVar9 = pAVar1 + uVar2;
    do {
      iVar4 = uVar5 - 1;
      if (iVar7 - uVar5 == -2) break;
      iVar7 = iVar7 + 1;
      piVar8 = &pAVar9->pc;
      pAVar9 = pAVar9 + 1;
      iVar4 = iVar7;
    } while (*piVar8 <= pc);
    piVar8 = &pAVar1[iVar4].line;
    iVar7 = pAVar1[iVar4].pc;
  }
  iVar4 = *piVar8;
  if (iVar7 < pc) {
    lVar6 = (long)iVar7;
    do {
      lVar3 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      iVar4 = iVar4 + f->lineinfo[lVar3];
    } while (pc != lVar6);
  }
  return iVar4;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}